

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError getnum(long *val,char *str,int base)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ParameterError PVar4;
  bool bVar5;
  curl_off_t num;
  char *local_28;
  long local_20;
  
  if (str == (char *)0x0) {
    return PARAM_BAD_NUMERIC;
  }
  local_28 = str;
  if (base == 10) {
    bVar5 = *str == '-';
    if (bVar5) {
      local_28 = str + 1;
    }
    iVar2 = Curl_str_number(&local_28,&local_20,0x7fffffffffffffff);
    if (iVar2 == 0) goto LAB_0011b608;
    PVar4 = PARAM_BAD_NUMERIC;
  }
  else {
    iVar2 = Curl_str_octal(&local_28,&local_20,0x7fffffffffffffff);
    PVar4 = PARAM_BAD_NUMERIC;
    bVar5 = false;
    bVar1 = false;
    if (iVar2 != 0) goto LAB_0011b635;
LAB_0011b608:
    PVar4 = PARAM_OK;
    iVar2 = Curl_str_single(&local_28,'\0');
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_0011b635;
    }
    lVar3 = -local_20;
    if (!bVar5) {
      lVar3 = local_20;
    }
    *val = lVar3;
  }
  bVar1 = false;
LAB_0011b635:
  if (bVar1) {
    return PARAM_BAD_NUMERIC;
  }
  return PVar4;
}

Assistant:

static ParameterError getnum(long *val, const char *str, int base)
{
  DEBUGASSERT((base == 8) || (base == 10));
  if(str) {
    curl_off_t num;
    bool is_neg = FALSE;
    if(base == 10) {
      is_neg = (*str == '-');
      if(is_neg)
        str++;
      if(curlx_str_number(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    else { /* base == 8 */
      if(curlx_str_octal(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    if(!curlx_str_single(&str, '\0')) {
      *val = (long)num;
      if(is_neg)
        *val = -*val;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}